

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void help(void)

{
  if (*prg_name == '\0') {
    prg_name = machine->asm_name;
  }
  printf("%s [-options] [-h (for help)] infile\n\n");
  puts(
      "-s/S        : show segment usage\n--segment/fullsegment\n-l #        : listing file output level (0-3)\n--listing #\n-m          : force macro expansion in listing\n--macro\n--raw       : prevent adding a ROM header\n-I          : add include path"
      );
  if (machine->type == 0) {
    puts(
        "--cd        : create a CD-ROM track image\n--scd       : create a Super CD-ROM track image\n--over(lay) : create an executable \'overlay\' program segment\n--dev(elo)  : assemble and run on the Develo Box\n--mx        : create a Develo MX file"
        );
  }
  puts(
      "--srec      : create a Motorola S-record file\n-h          : help. Displays this message\n--help"
      );
  puts("infile      : file to be assembled\n");
  return;
}

Assistant:

void
help(void)
{
	/* check program name */
	if (strlen(prg_name) == 0)
		prg_name = machine->asm_name;

	/* display help */
	printf("%s [-options] [-h (for help)] infile\n\n", prg_name);
	printf("-s/S        : show segment usage\n"
		   "--segment/fullsegment\n"
		   "-l #        : listing file output level (0-3)\n"
		   "--listing #\n"
		   "-m          : force macro expansion in listing\n"
		   "--macro\n"
		   "--raw       : prevent adding a ROM header\n"
		   "-I          : add include path\n");
	if (machine->type == MACHINE_PCE) {
		printf("--cd        : create a CD-ROM track image\n"
			   "--scd       : create a Super CD-ROM track image\n"
			   "--over(lay) : create an executable 'overlay' program segment\n"
			   "--dev(elo)  : assemble and run on the Develo Box\n"
			   "--mx        : create a Develo MX file\n");
	}
	printf("--srec      : create a Motorola S-record file\n"
		   "-h          : help. Displays this message\n"
		   "--help\n");
	
	printf("infile      : file to be assembled\n\n");
}